

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_relocate(_glist *x,t_symbol *canvasgeom,t_symbol *topgeom)

{
  int iVar1;
  undefined1 local_40 [4];
  undefined1 local_3c [4];
  int th;
  int tw;
  int typix;
  int txpix;
  int ch;
  int cw;
  int cypix;
  int cxpix;
  t_symbol *topgeom_local;
  t_symbol *canvasgeom_local;
  _glist *x_local;
  
  _cypix = topgeom;
  topgeom_local = canvasgeom;
  canvasgeom_local = (t_symbol *)x;
  iVar1 = __isoc99_sscanf(canvasgeom->s_name,"%dx%d+%d+%d",&txpix,&typix,&cw,&ch);
  if (3 < iVar1) {
    iVar1 = __isoc99_sscanf(_cypix->s_name,"%dx%d+%d+%d",local_3c,local_40,&tw,&th);
    if (3 < iVar1) goto LAB_001544f6;
  }
  bug("canvas_relocate");
LAB_001544f6:
  if ((5 < txpix) && (5 < typix)) {
    canvas_dosetbounds((_glist *)canvasgeom_local,tw,th,tw + txpix,th + typix);
  }
  return;
}

Assistant:

static void canvas_relocate(t_canvas *x, t_symbol *canvasgeom,
    t_symbol *topgeom)
{
    int cxpix, cypix, cw, ch, txpix, typix, tw, th;
    if (sscanf(canvasgeom->s_name, "%dx%d+%d+%d", &cw, &ch, &cxpix, &cypix)
        < 4 ||
        sscanf(topgeom->s_name, "%dx%d+%d+%d", &tw, &th, &txpix, &typix) < 4)
        bug("canvas_relocate");
            /* for some reason this is initially called with cw=ch=1 so
            we just suppress that here. */
    if (cw > 5 && ch > 5)
        canvas_dosetbounds(x, txpix, typix,
            txpix + cw, typix + ch);
}